

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dummy_dp.c
# Opt level: O1

void * DummyReadRemoteMemory
                 (CP_Services Svcs,DP_RS_Stream Stream_v,int Rank,size_t Timestep,size_t Offset,
                 size_t Length,void *Buffer,void *DP_TimestepInfo)

{
  undefined4 uVar1;
  CManager p_Var2;
  undefined4 *puVar3;
  size_t local_68;
  size_t sStack_60;
  size_t local_58;
  undefined8 uStack_50;
  DP_RS_Stream local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  p_Var2 = (*Svcs->getCManager)(*(void **)((long)Stream_v + 8));
  puVar3 = (undefined4 *)malloc(0x28);
  uVar1 = CMCondition_get(p_Var2,0);
  *puVar3 = uVar1;
  *(undefined8 *)(puVar3 + 4) = *(undefined8 *)((long)Stream_v + 8);
  *(CManager *)(puVar3 + 2) = p_Var2;
  *(void **)(puVar3 + 6) = Buffer;
  puVar3[8] = Rank;
  CMCondition_set_client_data(p_Var2,uVar1,puVar3);
  (*Svcs->verbose)(*(void **)((long)Stream_v + 8),5,
                   "Adios requesting to read remote memory for Timestep %d from Rank %d, WSR_Stream = %p\n"
                   ,Timestep,(ulong)(uint)Rank,
                   *(undefined8 *)(*(long *)((long)Stream_v + 0x28) + 8 + (long)Rank * 0x10),Offset,
                   Length);
  uStack_50 = *(undefined8 *)(*(long *)((long)Stream_v + 0x28) + 8 + (long)Rank * 0x10);
  _uStack_40 = CONCAT44(*puVar3,*(undefined4 *)((long)Stream_v + 0x18));
  local_68 = Timestep;
  sStack_60 = Offset;
  local_58 = Length;
  local_48 = Stream_v;
  (*Svcs->sendToPeer)(*(void **)((long)Stream_v + 8),*(CP_PeerCohort *)((long)Stream_v + 0x20),Rank,
                      *(CMFormat *)((long)Stream_v + 0x10),&local_68);
  return puVar3;
}

Assistant:

static void *DummyReadRemoteMemory(CP_Services Svcs, DP_RS_Stream Stream_v, int Rank,
                                   size_t Timestep, size_t Offset, size_t Length, void *Buffer,
                                   void *DP_TimestepInfo)
{
    Dummy_RS_Stream Stream =
        (Dummy_RS_Stream)Stream_v; /* DP_RS_Stream is the return from InitReader */
    CManager cm = Svcs->getCManager(Stream->CP_Stream);
    DummyCompletionHandle ret = malloc(sizeof(struct _DummyCompletionHandle));
    struct _DummyReadRequestMsg ReadRequestMsg;

    ret->CMcondition = CMCondition_get(cm, NULL);
    ret->CPStream = Stream->CP_Stream;
    ret->cm = cm;
    ret->Buffer = Buffer;
    ret->Rank = Rank;
    /*
     * set the completion handle as client Data on the condition so that
     * handler has access to it.
     */
    CMCondition_set_client_data(cm, ret->CMcondition, ret);

    Svcs->verbose(Stream->CP_Stream, DPTraceVerbose,
                  "Adios requesting to read remote memory for Timestep %d "
                  "from Rank %d, WSR_Stream = %p\n",
                  Timestep, Rank, Stream->WriterContactInfo[Rank].WS_Stream);

    /* send request to appropriate writer */
    /* memset avoids uninit byte warnings from valgrind */
    memset(&ReadRequestMsg, 0, sizeof(ReadRequestMsg));
    ReadRequestMsg.Timestep = Timestep;
    ReadRequestMsg.Offset = Offset;
    ReadRequestMsg.Length = Length;
    ReadRequestMsg.WS_Stream = Stream->WriterContactInfo[Rank].WS_Stream;
    ReadRequestMsg.RS_Stream = Stream;
    ReadRequestMsg.RequestingRank = Stream->Rank;
    ReadRequestMsg.NotifyCondition = ret->CMcondition;
    Svcs->sendToPeer(Stream->CP_Stream, Stream->PeerCohort, Rank, Stream->ReadRequestFormat,
                     &ReadRequestMsg);

    return ret;
}